

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::Compaction(Compaction *this,Options *options,int level)

{
  uint64_t uVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_28;
  int local_20;
  int i;
  int level_local;
  Options *options_local;
  Compaction *this_local;
  
  this->level_ = level;
  uVar1 = MaxFileSizeForLevel(options,level);
  this->max_output_file_size_ = uVar1;
  this->input_version_ = (Version *)0x0;
  VersionEdit::VersionEdit(&this->edit_);
  local_28 = this->inputs_;
  do {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector(local_28)
    ;
    local_28 = local_28 + 1;
  } while (local_28 != &this->grandparents_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            (&this->grandparents_);
  this->grandparent_index_ = 0;
  this->seen_key_ = false;
  this->overlapped_bytes_ = 0;
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    this->level_ptrs_[local_20] = 0;
  }
  return;
}

Assistant:

Compaction::Compaction(const Options* options, int level)
    : level_(level),
      max_output_file_size_(MaxFileSizeForLevel(options, level)),
      input_version_(nullptr),
      grandparent_index_(0),
      seen_key_(false),
      overlapped_bytes_(0) {
  for (int i = 0; i < config::kNumLevels; i++) {
    level_ptrs_[i] = 0;
  }
}